

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlf.h
# Opt level: O0

void __thiscall TLF<4U>::Init(TLF<4U> *this,Data<4U> *from,Data<4U> *to)

{
  bool bVar1;
  uint uVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  Data<4U> *in_RDX;
  Data<4U> *in_RSI;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_RDI;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [16];
  undefined1 in_ZMM1 [64];
  Stream<4U> stream;
  uint Max;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_58;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_50;
  _Node_iterator_base<std::pair<const_Stream<4U>,_int>,_true> local_48;
  _Node_iterator_base<std::pair<const_Stream<4U>,_int>,_true> local_40;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_38;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_30;
  Stream<4U> local_24;
  undefined4 local_1c;
  
  auVar6 = in_ZMM1._0_16_;
  auVar5 = in_ZMM0._0_16_;
  local_1c = 0xffffffff;
  Stream<4U>::Stream(&local_24,in_RSI,in_RDX);
  uVar2 = Stream<4U>::Hash((Stream<4U> *)in_RDI,in_stack_ffffffffffffff9c);
  auVar5 = vcvtusi2sd_avx512f(auVar5,uVar2);
  auVar6 = vcvtusi2sd_avx512f(auVar6,local_1c);
  if (auVar5._0_8_ / auVar6._0_8_ < (double)in_RDI[2]._M_h._M_buckets) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::find((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                (key_type *)0x113ab3);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::end((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar1 = std::__detail::operator!=(&local_30,&local_38);
    if (bVar1) {
      local_40._M_cur =
           (__node_type *)
           std::
           unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
           ::find((unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                  (key_type *)0x113afc);
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
           ::end((unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      bVar1 = std::__detail::operator==(&local_40,&local_48);
      if (bVar1) {
        pmVar3 = std::
                 unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
                 ::operator[]((unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
                               *)in_RDI,
                              (key_type *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        *pmVar3 = 1;
        local_50._M_cur =
             (__node_type *)
             std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::find((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (key_type *)0x113b5e);
        local_58._M_cur =
             (__node_type *)
             std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::end((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        bVar1 = std::__detail::operator==(&local_50,&local_58);
        if (bVar1) {
          pmVar4 = std::
                   unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   ::operator[](in_RDI,(key_type *)
                                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                               );
          *pmVar4 = 1;
        }
        else {
          pmVar4 = std::
                   unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   ::operator[](in_RDI,(key_type *)
                                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                               );
          *pmVar4 = *pmVar4 + 1;
        }
      }
    }
    else {
      pmVar4 = std::
               unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
               ::operator[](in_RDI,(key_type *)
                                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      *pmVar4 = 1;
    }
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& from, const Data<DATA_LEN>& to) {
		uint Max = 0xffffffff;
		Stream<DATA_LEN> stream(from, to);
		if (stream.Hash() / (double)Max < epsilon) {
			if (ip.find(from) != ip.end()) {
				if (sp.find(stream) == sp.end()) {
					sp[stream] = 1;
					if (mp.find(from) == mp.end())
						mp[from] = 1;
					else
						mp[from] += 1;
				}
			}
			else {
				ip[from] = 1;
			}
		}
	}